

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O2

void __thiscall SGParser::Generator::StdGrammarStackElement::Cleanup(StdGrammarStackElement *this)

{
  StdGrammarStackElement *pSVar1;
  StdGrammarStackElement *pSVar2;
  StdGrammarStackElement *se;
  ulong uStack_30;
  
  pSVar2 = (StdGrammarStackElement *)(this->field_1).pStringVec;
  if (pSVar2 == (StdGrammarStackElement *)0x0) {
    return;
  }
  switch(this->Type + 0xf0000000 >> 0x1c) {
  case 0:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                  ,0x206,"void SGParser::Generator::StdGrammarStackElement::Cleanup()");
  case 1:
    std::__cxx11::string::~string((string *)pSVar2);
    uStack_30 = 0x20;
    break;
  case 2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pSVar2);
    goto LAB_0012a119;
  case 3:
    Cleanup(pSVar2);
    pSVar2 = (StdGrammarStackElement *)(this->field_1).pData;
    uStack_30 = 0x38;
    break;
  case 4:
    pSVar1 = (StdGrammarStackElement *)
             (pSVar2->super_ParseStackElement<SGParser::Generator::StdGrammarToken>).TerminalMarker;
    for (pSVar2 = *(StdGrammarStackElement **)
                   &pSVar2->super_ParseStackElement<SGParser::Generator::StdGrammarToken>;
        pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
      Cleanup(pSVar2);
    }
    pSVar2 = (StdGrammarStackElement *)(this->field_1).pString;
    if (pSVar2 != (StdGrammarStackElement *)0x0) {
      std::
      _Vector_base<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
      ::~_Vector_base((_Vector_base<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
                       *)pSVar2);
    }
LAB_0012a119:
    uStack_30 = 0x18;
    break;
  default:
    goto switchD_0012a0d6_default;
  }
  operator_delete(pSVar2,uStack_30);
switchD_0012a0d6_default:
  (this->field_1).pData = (void *)0x0;
  return;
}

Assistant:

void Cleanup() {
        if (!pData)
            return;

        switch (Type & DataTypeMask) {
            case DataVoid:      SG_ASSERT(false);  break; // Shouldn't be here
            case DataString:    delete pString;    break;
            case DataStringVec: delete pStringVec; break;

            case DataStackElement:
                pStackElement->Cleanup();
                delete pStackElement;
                break;

            case DataStackElementVec:
                for (auto& se : *pStackElementVec)
                    se.Cleanup();
                delete pStackElementVec;
                break;
        }

        pData = nullptr;
    }